

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::~TPZFrontMatrix(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                  *this,void **vtt)

{
  TPZVec<int> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI->_vptr_TPZVec;
  TPZVec<int>::~TPZVec(in_RSI);
  TPZVec<int>::~TPZVec(in_RSI);
  TPZFrontSym<std::complex<float>_>::~TPZFrontSym((TPZFrontSym<std::complex<float>_> *)0x1ceef46);
  TPZFileEqnStorage<std::complex<float>_>::~TPZFileEqnStorage
            ((TPZFileEqnStorage<std::complex<float>_> *)0x1ceef54);
  TPZAbstractFrontMatrix<std::complex<float>_>::~TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<std::complex<float>_> *)in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}